

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O2

void ut11::Assert::That<std::__cxx11::string,ut11::Operands::EqualTo<char[133]>>
               (size_t line,string *file,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
               EqualTo<char[133]> *operand)

{
  bool bVar1;
  string local_60;
  string local_40;
  
  bVar1 = Operands::EqualTo<char[133]>::operator()(operand,expected);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)file);
    Operands::EqualTo<char[133]>::GetErrorMessage<std::__cxx11::string>(&local_60,operand,expected);
    Fail(line,&local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}